

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonObjectWriter::~JsonObjectWriter(JsonObjectWriter *this)

{
  ostream *in_RDI;
  uint64_t in_stack_ffffffffffffffe8;
  
  if (((byte)in_RDI[0x11] & 1) != 0) {
    std::operator<<(*(ostream **)in_RDI,'\n');
    JsonUtils::indent(in_RDI,in_stack_ffffffffffffffe8);
    std::operator<<(*(ostream **)in_RDI,'}');
  }
  return;
}

Assistant:

JsonObjectWriter::~JsonObjectWriter() {
        if ( !m_active ) { return; }

        m_os << '\n';
        JsonUtils::indent( m_os, m_indent_level );
        m_os << '}';
    }